

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRSDA::IntLoadResidual_F(ChLinkRSDA *this,uint off,ChVectorDynamic<> *R,double c)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 in_register_00000034;
  double c_local;
  ChVector<double> torque;
  ChVector<double> *local_b0 [2];
  ChVector<double> local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_88;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_58 [56];
  
  c_local = c;
  iVar2 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off));
  if ((char)iVar2 != '\0') {
    dVar1 = this->m_torque;
    torque.m_data[0] = dVar1 * (this->m_axis).m_data[0];
    torque.m_data[1] = dVar1 * (this->m_axis).m_data[1];
    torque.m_data[2] = dVar1 * (this->m_axis).m_data[2];
    iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var,iVar2) + 0x2c) == '\0') {
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_a0,(ChFrame<double> *)(this->super_ChLink).Body1,&torque);
      local_b0[0] = &local_a0;
      Eigen::operator*(&local_88,&c_local,(StorageBaseType *)local_b0);
      iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,R,
                 (long)*(int *)(CONCAT44(extraout_var_00,iVar2) + 0x30) + 3,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                           *)&local_88);
    }
    iVar2 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var_01,iVar2) + 0x2c) == '\0') {
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_a0,(ChFrame<double> *)(this->super_ChLink).Body2,&torque);
      local_b0[0] = &local_a0;
      Eigen::operator*(&local_88,&c_local,(StorageBaseType *)local_b0);
      iVar2 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,R,
                 (long)*(int *)(CONCAT44(extraout_var_02,iVar2) + 0x30) + 3,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                           *)&local_88);
    }
  }
  return;
}

Assistant:

void ChLinkRSDA::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    if (!IsActive())
        return;

    // Applied torque in absolute frame
    ChVector<> torque = m_torque * m_axis;

    // Load torques in 'R' vector accumulator (torques in local coords)
    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 3, 3) -= c * Body1->TransformDirectionParentToLocal(torque).eigen();
    }
    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 3, 3) += c * Body2->TransformDirectionParentToLocal(torque).eigen();
    }
}